

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffgstm(char *timestr,int *timeref,int *status)

{
  int *in_RDX;
  undefined4 *in_RSI;
  char *in_RDI;
  tm *ptr;
  time_t tp;
  tm *local_30;
  time_t local_28;
  int *local_20;
  undefined4 *local_18;
  char *local_10;
  int local_4;
  
  if (*in_RDX < 1) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    time(&local_28);
    local_30 = gmtime(&local_28);
    if (local_18 != (undefined4 *)0x0) {
      if (local_30 == (tm *)0x0) {
        *local_18 = 1;
      }
      else {
        *local_18 = 0;
      }
    }
    if (local_30 == (tm *)0x0) {
      local_30 = localtime(&local_28);
    }
    strftime(local_10,0x19,"%Y-%m-%dT%H:%M:%S",local_30);
    local_4 = *local_20;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffgstm( char *timestr,   /* O  - returned system date and time string  */
            int  *timeref,   /* O - GMT = 0, Local time = 1  */
            int   *status)   /* IO - error status      */
/*
  Returns the current date and time in format 'yyyy-mm-ddThh:mm:ss'.
*/
{
    time_t tp;
    struct tm *ptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    time(&tp);
    ptr = gmtime(&tp);         /* get GMT (= UTC) time */

    if (timeref)
    {
        if (ptr)
            *timeref = 0;   /* returning GMT */
        else
            *timeref = 1;   /* returning local time */
    }

    if (!ptr)                  /* GMT not available on this machine */
        ptr = localtime(&tp); 

    strftime(timestr, 25, "%Y-%m-%dT%H:%M:%S", ptr);

    return(*status);
}